

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.cpp
# Opt level: O2

unique_ptr<duckdb::CompressionState,_std::default_delete<duckdb::CompressionState>,_true> __thiscall
duckdb::ZSTDStorage::InitCompression
          (ZSTDStorage *this,ColumnDataCheckpointData *checkpoint_data,
          unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>,_true>
          *analyze_state_p)

{
  undefined8 uVar1;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::AnalyzeState_*,_false> local_18;
  undefined8 local_10;
  
  local_18._M_head_impl =
       (analyze_state_p->
       super_unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>)._M_t.
       super___uniq_ptr_impl<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::AnalyzeState_*,_std::default_delete<duckdb::AnalyzeState>_>.
       super__Head_base<0UL,_duckdb::AnalyzeState_*,_false>._M_head_impl;
  (analyze_state_p->
  super_unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>)._M_t.
  super___uniq_ptr_impl<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::AnalyzeState_*,_std::default_delete<duckdb::AnalyzeState>_>.
  super__Head_base<0UL,_duckdb::AnalyzeState_*,_false>._M_head_impl = (AnalyzeState *)0x0;
  make_uniq<duckdb::ZSTDCompressionState,duckdb::ColumnDataCheckpointData&,duckdb::unique_ptr<duckdb::ZSTDAnalyzeState,std::default_delete<duckdb::ZSTDAnalyzeState>,true>>
            ((duckdb *)&local_10,checkpoint_data,
             (unique_ptr<duckdb::ZSTDAnalyzeState,_std::default_delete<duckdb::ZSTDAnalyzeState>,_true>
              *)&local_18);
  uVar1 = local_10;
  local_10 = 0;
  *(undefined8 *)this = uVar1;
  if (local_18._M_head_impl != (AnalyzeState *)0x0) {
    (*(local_18._M_head_impl)->_vptr_AnalyzeState[1])();
  }
  return (unique_ptr<duckdb::CompressionState,_std::default_delete<duckdb::CompressionState>_>)
         (unique_ptr<duckdb::CompressionState,_std::default_delete<duckdb::CompressionState>_>)this;
}

Assistant:

idx_t NewSegment() {
		if (current_buffer == &segment_handle) {
			// This should never happen, the string lengths + vector metadata size should always exceed a page size,
			// even if the strings are all empty
			throw InternalException("We are asking for a new segment, but somehow we're still writing vector data onto "
			                        "the initial (segment) page");
		}
		idx_t row_start;
		if (segment) {
			row_start = segment->start + segment->count;
			FlushSegment();
		} else {
			row_start = checkpoint_data.GetRowGroup().start;
		}
		CreateEmptySegment(row_start);

		// Figure out how many vectors we are storing in this segment
		idx_t vectors_in_segment;
		if (segment_count + 1 >= total_segment_count) {
			vectors_in_segment = total_vector_count - vector_count;
		} else {
			vectors_in_segment = vectors_per_segment;
		}

		idx_t offset = 0;
		page_ids = reinterpret_cast<page_id_t *>(segment_handle.Ptr() + offset);
		offset += (sizeof(page_id_t) * vectors_in_segment);

		offset = AlignValue<idx_t, sizeof(page_offset_t)>(offset);
		page_offsets = reinterpret_cast<page_offset_t *>(segment_handle.Ptr() + offset);
		offset += (sizeof(page_offset_t) * vectors_in_segment);

		offset = AlignValue<idx_t, sizeof(uncompressed_size_t)>(offset);
		uncompressed_sizes = reinterpret_cast<uncompressed_size_t *>(segment_handle.Ptr() + offset);
		offset += (sizeof(uncompressed_size_t) * vectors_in_segment);

		offset = AlignValue<idx_t, sizeof(compressed_size_t)>(offset);
		compressed_sizes = reinterpret_cast<compressed_size_t *>(segment_handle.Ptr() + offset);
		offset += (sizeof(compressed_size_t) * vectors_in_segment);

		D_ASSERT(offset == GetVectorMetadataSize(vectors_in_segment));
		return offset;
	}